

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O3

shared<boost::ext::di::v1_3_0::scopes::singleton,_c_non_explicit,_std::shared_ptr<c_non_explicit>_&>
__thiscall
boost::ext::di::v1_3_0::scopes::singleton::
scope_impl<c_non_explicit,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
create_impl<c_non_explicit,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<c_non_explicit,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_ref_fwd<c_non_explicit>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>
          (scope_impl<c_non_explicit,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
           *this,provider<boost::ext::di::v1_3_0::aux::pair<c_non_explicit,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_ref_fwd<c_non_explicit>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
                 *provider)

{
  int iVar1;
  heap local_13;
  direct local_12;
  stack_over_heap local_11;
  any_type_1st_ref<c_non_explicit,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
  local_10;
  
  if (create_impl<c_non_explicit,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<c_non_explicit,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_ref_fwd<c_non_explicit>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>(boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<c_non_explicit,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_ref_fwd<c_non_explicit>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>const&)
      ::object == '\0') {
    iVar1 = __cxa_guard_acquire(&create_impl<c_non_explicit,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<c_non_explicit,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_ref_fwd<c_non_explicit>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>(boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<c_non_explicit,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_ref_fwd<c_non_explicit>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>const&)
                                 ::object);
    if (iVar1 != 0) {
      local_10.injector_ = provider->injector_;
      scope_impl<c_non_explicit,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>::
      create_impl<c_non_explicit,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<c_non_explicit,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_ref_fwd<c_non_explicit>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>_>
      ::object.super___shared_ptr<c_non_explicit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           providers::stack_over_heap::
           get<c_non_explicit,boost::ext::di::v1_3_0::core::successful::any_type_1st_ref<c_non_explicit,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>
                     (&local_11,&local_12,&local_13,&local_10);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<c_non_explicit*>
                (&scope_impl<c_non_explicit,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
                  ::
                  create_impl<c_non_explicit,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<c_non_explicit,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_ref_fwd<c_non_explicit>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>_>
                  ::object.super___shared_ptr<c_non_explicit,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 scope_impl<c_non_explicit,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
                 ::
                 create_impl<c_non_explicit,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<c_non_explicit,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_ref_fwd<c_non_explicit>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>_>
                 ::object.super___shared_ptr<c_non_explicit,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      __cxa_atexit(std::__shared_ptr<c_non_explicit,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   &scope_impl<c_non_explicit,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
                    ::
                    create_impl<c_non_explicit,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<c_non_explicit,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_ref_fwd<c_non_explicit>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>_>
                    ::object,&__dso_handle);
      __cxa_guard_release(&create_impl<c_non_explicit,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<c_non_explicit,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_ref_fwd<c_non_explicit>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>(boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<c_non_explicit,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_ref_fwd<c_non_explicit>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>const&)
                           ::object);
    }
  }
  return (shared<boost::ext::di::v1_3_0::scopes::singleton,_c_non_explicit,_std::shared_ptr<c_non_explicit>_&>
          )&scope_impl<c_non_explicit,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
            ::
            create_impl<c_non_explicit,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<c_non_explicit,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_ref_fwd<c_non_explicit>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>_>
            ::object;
}

Assistant:

auto create_impl(const TProvider& provider) {
      static std::shared_ptr<T_> object{provider.get()};
      return wrappers::shared<singleton, T_, std::shared_ptr<T_>&>{object};
    }